

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iibmalloc.cpp
# Opt level: O1

void * operator_new__(size_t count,align_val_t al)

{
  IibAllocatorBase *this;
  long lVar1;
  void *ret_1;
  undefined8 *puVar2;
  _func_int *p_Var3;
  undefined1 *puVar4;
  uint uVar5;
  unsigned_long __n2;
  ulong uVar6;
  byte szidx;
  long in_FS_OFFSET;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_01;
  void *ret;
  buffer<char> local_590;
  ulong local_570;
  long local_568;
  _func_int **local_560;
  char local_558 [256];
  _func_int *local_458 [2];
  align_val_t local_448;
  unsigned_long local_430;
  _func_int *local_428 [127];
  undefined2 local_2c;
  undefined1 local_2a;
  undefined1 local_29;
  
  if (*(long *)(in_FS_OFFSET + -0x20) == 0) {
    if (0x20 < al) {
      local_448 = 0x20;
      local_570 = 0;
      local_568 = 0x3ff;
      local_590.size_ = 0;
      local_590.capacity_ = 0x100;
      local_590._vptr_buffer = (_func_int **)&PTR_grow_00129a00;
      local_560 = local_428;
      format_str_00.size_ = 9;
      format_str_00.data_ = "{} vs. {}";
      args_00.field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           local_458;
      args_00.desc_ = 0x44;
      local_590.ptr_ = local_558;
      local_458[0] = (_func_int *)al;
      fmt::v7::detail::vformat_to<char>(&local_590,format_str_00,args_00);
      uVar6 = local_568 - local_570;
      local_570 = local_570 + local_590.size_;
      if (local_590.size_ <= uVar6) {
        uVar6 = local_590.size_;
      }
      if (uVar6 != 0) {
        memmove(local_560,local_558,uVar6);
      }
      if (local_570 < 0x400) {
        puVar4 = (undefined1 *)((long)local_428 + local_570);
      }
      else {
        puVar4 = &local_29;
        local_2c = 0x2e2e;
        local_2a = 0x2e;
      }
      *puVar4 = 0;
      nodecpp::assert::onAssertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.cpp"
                 ,0x83,"(size_t)al <= NODECPP_MAX_SUPPORTED_ALIGNMENT_FOR_NEW",(char *)local_428,
                 true);
    }
    p_Var3 = (_func_int *)malloc(count);
    if (p_Var3 == (_func_int *)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = clock_gettime;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    goto LAB_0010e3e3;
  }
  if (0x20 < al) {
    local_448 = 0x20;
    local_570 = 0;
    local_568 = 0x3ff;
    local_590.size_ = 0;
    local_590.capacity_ = 0x100;
    local_590._vptr_buffer = (_func_int **)&PTR_grow_00129a00;
    local_560 = local_428;
    format_str.size_ = 9;
    format_str.data_ = "{} vs. {}";
    args.field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         local_458;
    args.desc_ = 0x44;
    local_590.ptr_ = local_558;
    local_458[0] = (_func_int *)al;
    fmt::v7::detail::vformat_to<char>(&local_590,format_str,args);
    uVar6 = local_568 - local_570;
    local_570 = local_570 + local_590.size_;
    if (local_590.size_ <= uVar6) {
      uVar6 = local_590.size_;
    }
    if (uVar6 != 0) {
      memmove(local_560,local_558,uVar6);
    }
    if (local_570 < 0x400) {
      puVar4 = (undefined1 *)((long)local_428 + local_570);
    }
    else {
      puVar4 = &local_29;
      local_2c = 0x2e2e;
      local_2a = 0x2e;
    }
    *puVar4 = 0;
    nodecpp::assert::onAssertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.cpp"
               ,0x7e,"(size_t)al <= ThreadLocalAllocatorT::maximalSupportedAlignment",
               (char *)local_428,true);
  }
  this = *(IibAllocatorBase **)(in_FS_OFFSET + -0x20);
  local_428[0] = (_func_int *)0x0;
  if (count < 0x31) {
    p_Var3 = (_func_int *)this->buckets[6];
    if (p_Var3 == (_func_int *)0x0) {
      count = 0x31;
      szidx = 6;
LAB_0010e38b:
      p_Var3 = (_func_int *)
               nodecpp::iibmalloc::IibAllocatorBase::allocateInCaseNoFreeBucket(this,count,szidx);
    }
    else {
      this->buckets[6] = *(void **)p_Var3;
    }
  }
  else if (count < 0x2001) {
    uVar6 = count - 1;
    lVar1 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar5 = (uint)lVar1 ^ 0x3f;
    szidx = 0x79 - ((char)uVar5 * '\x02' - ((uVar6 >> ((ulong)(0x3e - uVar5) & 0x3f) & 1) != 0));
    if (0x3f < szidx) {
      nodecpp::assert::onAssertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                 ,0x459,"szidx < BucketCount",true);
    }
    p_Var3 = (_func_int *)this->buckets[szidx];
    if (p_Var3 == (_func_int *)0x0) goto LAB_0010e38b;
    this->buckets[szidx] = *(void **)p_Var3;
  }
  else {
    p_Var3 = (_func_int *)
             nodecpp::iibmalloc::IibAllocatorBase::allocateInCaseTooLargeForBucket(this,count);
  }
  local_590._vptr_buffer = local_428;
  local_430 = 0x20;
  local_458[0] = p_Var3;
  local_428[0] = p_Var3;
  nodecpp::assert::
  nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)2,nodecpp::iibmalloc::IibAllocatorBase::allocateAligned<32ul>(unsigned_long)::_lambda()_1_,unsigned_long,unsigned_long>
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
             ,0x4a4,(anon_class_8_1_ba1d7401 *)&local_590,"((uintptr_t)ret & (alignment - 1)) == 0",
             "ret = 0x{:x}, alignment = {}",(unsigned_long *)local_458,&local_430);
  p_Var3 = local_428[0];
LAB_0010e3e3:
  if ((al - 1 & (ulong)p_Var3) != 0) {
    local_570 = 0;
    local_568 = 0x3ff;
    local_590.size_ = 0;
    local_590.capacity_ = 0x100;
    local_590._vptr_buffer = (_func_int **)&PTR_grow_00129a00;
    local_560 = local_428;
    format_str_01.size_ = 0x15;
    format_str_01.data_ = "ret = 0x{:x}, al = {}";
    args_01.field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         local_458;
    args_01.desc_ = 0x44;
    local_590.ptr_ = local_558;
    local_458[0] = p_Var3;
    local_448 = al;
    fmt::v7::detail::vformat_to<char>(&local_590,format_str_01,args_01);
    uVar6 = local_568 - local_570;
    local_570 = local_570 + local_590.size_;
    if (local_590.size_ <= uVar6) {
      uVar6 = local_590.size_;
    }
    if (uVar6 != 0) {
      memmove(local_560,local_558,uVar6);
    }
    if (local_570 < 0x400) {
      puVar4 = (undefined1 *)((long)local_428 + local_570);
    }
    else {
      puVar4 = &local_29;
      local_2c = 0x2e2e;
      local_2a = 0x2e;
    }
    *puVar4 = 0;
    nodecpp::assert::onAssertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.cpp"
               ,0x86,"( (size_t)ret & ((size_t)al - 1)) == 0",(char *)local_428,true);
  }
  return p_Var3;
}

Assistant:

void* operator new[](std::size_t count, std::align_val_t al)
{
	void* ret;
	if ( g_CurrentAllocManager )
	{
		NODECPP_ASSERT( nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::pedantic, (size_t)al <= ThreadLocalAllocatorT::maximalSupportedAlignment, "{} vs. {}", (size_t)al, ThreadLocalAllocatorT::maximalSupportedAlignment );
		ret = g_CurrentAllocManager->allocateAligned<NODECPP_MAX_SUPPORTED_ALIGNMENT_FOR_NEW>(count);
	}
	else
	{
		NODECPP_ASSERT( nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::pedantic, (size_t)al <= NODECPP_MAX_SUPPORTED_ALIGNMENT_FOR_NEW, "{} vs. {}", (size_t)al, NODECPP_MAX_SUPPORTED_ALIGNMENT_FOR_NEW );
		ret = nodecpp::StdRawAllocator::allocate<NODECPP_MAX_SUPPORTED_ALIGNMENT_FOR_NEW>(count);
	}
	NODECPP_ASSERT( nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::pedantic, ( (size_t)ret & ((size_t)al - 1)) == 0, "ret = 0x{:x}, al = {}", (size_t)ret, (size_t)al );
	return ret; 
}